

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O3

void __thiscall egc::Sequencer::MSU(Sequencer *this,unsigned_short instruction)

{
  long lVar1;
  long lVar2;
  ushort uVar3;
  unsigned_short word;
  unsigned_short address;
  ostream *poVar4;
  ushort uVar5;
  ushort uVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MSU",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 0x40;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  lVar1 = *(long *)poVar4;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  word = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,instruction & 0x3ff,0);
  address = Memory::Read((this->m_Memory).
                         super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,0);
  uVar3 = -(word & 0x3fff);
  if ((word >> 0xe & 1) == 0) {
    uVar3 = word & 0x3fff;
  }
  uVar5 = -(address & 0x3fff);
  if ((address >> 0xe & 1) != 0) {
    uVar5 = address & 0x3fff;
  }
  uVar6 = 0x7ffe;
  if (0 < (short)(uVar5 + uVar3)) {
    uVar6 = 0x3fff;
  }
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                instruction & 0x3ff,word);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                address,uVar6 & uVar5 + uVar3);
  return;
}

Assistant:

void egc::Sequencer::MSU (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "MSU" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);
    auto a = m_Memory->Read(00000u);

    auto digitsMk = static_cast<short>(mk & 037777u);
    auto digitsA = static_cast<short>(a & 037777u);

    auto signMk = mk & 040000u;
    auto signA = a & 040000u;

    if (signMk)
    {
        digitsMk *= -1;
    }
    if (signA)
    {
        digitsA *= -1;
    }

    auto resultTwoComplement = digitsMk - digitsA;

    unsigned short result;

    if (resultTwoComplement > 0)
    {
        result = static_cast<unsigned short>(resultTwoComplement) & 037777u;
    }
    else
    {
        result = static_cast<unsigned short>(resultTwoComplement) & 077777u - 000001u;
    }

    m_Memory->Write(k, mk);
    m_Memory->Write(a, result);
}